

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

void cfd::core::FreeWallyBuffer(void *source)

{
  CfdException *this;
  int ret;
  wally_operations ops;
  int local_9c;
  undefined1 local_98 [32];
  wally_operations local_78;
  
  local_78.malloc_fn = (wally_malloc_t)0x0;
  local_78.reserved_3 = (void *)0x0;
  local_78.reserved_4 = (void *)0x0;
  local_78.reserved_1 = (void *)0x0;
  local_78.reserved_2 = (void *)0x0;
  local_78.ec_nonce_fn = (wally_ec_nonce_t)0x0;
  local_78.secp_context_fn = (secp_context_t)0x0;
  local_78.free_fn = (wally_free_t)0x0;
  local_78.bzero_fn = (wally_bzero_t)0x0;
  local_78.struct_size = 0x50;
  local_9c = wally_get_operations(&local_78);
  if (local_9c == 0) {
    (*local_78.free_fn)(source);
    return;
  }
  local_98._0_8_ = "cfdcore_psbt.cpp";
  local_98._8_4_ = 0x1b3;
  local_98._16_8_ = "FreeWallyBuffer";
  logger::log<int&>((CfdSourceLocation *)local_98,kCfdLogLevelWarning,"wally_get_operations NG[{}]",
                    &local_9c);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_98._0_8_ = local_98 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,"OperationFunctions get error.","");
  CfdException::CfdException(this,kCfdInternalError,(string *)local_98);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void FreeWallyBuffer(void *source) {
  wally_free_t free_func = nullptr;

  int ret;
  if (free_func == nullptr) {
    struct wally_operations ops;
    memset(&ops, 0, sizeof(ops));
    ops.struct_size = sizeof(ops);
    ret = wally_get_operations(&ops);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_get_operations NG[{}]", ret);
      throw CfdException(kCfdInternalError, "OperationFunctions get error.");
    }
    free_func = ops.free_fn;
  }
  free_func(source);
}